

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Frame * rw::cloneRecurse(Frame *old,Frame *newroot)

{
  Frame *this;
  Frame *pFVar1;
  EVP_PKEY_CTX *src;
  Frame *clonedchild;
  Frame *child;
  Frame *frame;
  Frame *newroot_local;
  Frame *old_local;
  
  this = Frame::create();
  frame = newroot;
  if (newroot == (Frame *)0x0) {
    frame = this;
  }
  Object::copy(&this->object,(EVP_PKEY_CTX *)old,src);
  memcpy(&this->matrix,&old->matrix,0x40);
  this->root = frame;
  old->root = this;
  for (clonedchild = old->child; clonedchild != (Frame *)0x0; clonedchild = clonedchild->next) {
    pFVar1 = cloneRecurse(clonedchild,frame);
    pFVar1->next = this->child;
    this->child = pFVar1;
    (pFVar1->object).parent = this;
  }
  PluginList::copy((PluginList *)&Frame::s_plglist,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)old);
  return this;
}

Assistant:

static Frame*
cloneRecurse(Frame *old, Frame *newroot)
{
	Frame *frame = Frame::create();
	if(newroot == nil)
		newroot = frame;
	frame->object.copy(&old->object);
	frame->matrix = old->matrix;
	frame->root = newroot;
	old->root = frame;	// Remember cloned frame
	for(Frame *child = old->child; child; child = child->next){
		Frame *clonedchild = cloneRecurse(child, newroot);
		clonedchild->next = frame->child;
		frame->child = clonedchild;
		clonedchild->object.parent = frame;
	}
	Frame::s_plglist.copy(frame, old);
	return frame;
}